

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O0

void __thiscall
agge::tests::LayoutTests::NextWordIsDisplayedWithoutSpacesOnWordBreakWhenNextWordIsFound
          (LayoutTests *this)

{
  wrap limiter;
  element_type *font_factory_;
  glyph *local_558;
  allocator local_519;
  string local_518;
  LocationInfo local_4f8;
  text_line *local_4d0;
  text_line *local_4c8;
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_4c0;
  int local_4a8 [2];
  vector<int,_std::allocator<int>_> local_4a0;
  vector<int,_std::allocator<int>_> local_488;
  undefined1 local_470 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_428;
  ref_text_line local_410;
  int local_3e8 [4];
  vector<int,_std::allocator<int>_> local_3d8;
  vector<int,_std::allocator<int>_> local_3c0;
  vector<int,_std::allocator<int>_> local_3a8;
  vector<int,_std::allocator<int>_> local_390;
  undefined1 local_378 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_330;
  ref_text_line local_318;
  int local_2ec [5];
  vector<int,_std::allocator<int>_> local_2d8;
  vector<int,_std::allocator<int>_> local_2c0;
  vector<int,_std::allocator<int>_> local_2a8;
  vector<int,_std::allocator<int>_> local_290;
  vector<int,_std::allocator<int>_> local_278;
  undefined1 local_260 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_218;
  ref_text_line local_200;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_1d8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_1c0;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_1a8;
  wrap local_190;
  allocator local_171;
  string local_170;
  richtext_t local_150;
  undefined1 local_e8 [8];
  layout l;
  undefined1 local_88 [8];
  factory_ptr f;
  glyph glyphs [2];
  char_to_index indices [2];
  LayoutTests *this_local;
  
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x41;
  f.super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4014000000000000;
  glyphs[0].metrics.dx = 0.0;
  glyphs[0].metrics.dy = 0.0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[0].metrics.dy);
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4010000000000000;
  glyphs[1].metrics.dx = 0.0;
  glyphs[1].metrics.dy = 0.0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[1].metrics.dy);
  create_single_font_factory<2ul,2ul>
            ((LayoutTests *)local_88,(font_metrics *)this,
             (char_to_index (*) [2])(anonymous_namespace)::c_fm1,
             (glyph (*) [2])
             &glyphs[1].outline.
              super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  layout::layout((layout *)local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"AAAAA   AAAA    AA",&local_171);
  R(&local_150,&local_170);
  limit::wrap::wrap(&local_190,39.0);
  font_factory_ =
       std::
       __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
       ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_88);
  limiter._eow.next = local_190._eow.next;
  limiter._sow.extent = local_190._sow.extent;
  limiter._limit = local_190._limit;
  limiter._eow.extent = local_190._eow.extent;
  limiter._sow.next = local_190._sow.next;
  limiter._previous_space = local_190._previous_space;
  limiter._21_3_ = local_190._21_3_;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            ((layout *)local_e8,&local_150,limiter,font_factory_);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_88);
  font_factory::operator*((font_factory *)local_260);
  local_2ec[4] = 0;
  plural_::operator+(&local_2d8,(plural_ *)&plural,local_2ec + 4);
  local_2ec[3] = 0;
  tests::operator+(&local_2c0,&local_2d8,local_2ec + 3);
  local_2ec[2] = 0;
  tests::operator+(&local_2a8,&local_2c0,local_2ec + 2);
  local_2ec[1] = 0;
  tests::operator+(&local_290,&local_2a8,local_2ec + 1);
  local_2ec[0] = 0;
  tests::operator+(&local_278,&local_290,local_2ec);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_260 + 0x10),(shared_ptr<agge::font> *)local_260,0.0,0.0,
             &local_278);
  plural_::operator+(&local_218,(plural_ *)&plural,(ref_glyph_run *)(local_260 + 0x10));
  ref_text_line::ref_text_line(&local_200,0.0,10.0,0.0,&local_218);
  plural_::operator+(&local_1d8,(plural_ *)&plural,&local_200);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_88);
  font_factory::operator*((font_factory *)local_378);
  local_3e8[3] = 0;
  plural_::operator+(&local_3d8,(plural_ *)&plural,local_3e8 + 3);
  local_3e8[2] = 0;
  tests::operator+(&local_3c0,&local_3d8,local_3e8 + 2);
  local_3e8[1] = 0;
  tests::operator+(&local_3a8,&local_3c0,local_3e8 + 1);
  local_3e8[0] = 0;
  tests::operator+(&local_390,&local_3a8,local_3e8);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_378 + 0x10),(shared_ptr<agge::font> *)local_378,0.0,0.0,
             &local_390);
  plural_::operator+(&local_330,(plural_ *)&plural,(ref_glyph_run *)(local_378 + 0x10));
  ref_text_line::ref_text_line(&local_318,0.0,24.0,0.0,&local_330);
  tests::operator+(&local_1c0,&local_1d8,&local_318);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_88);
  font_factory::operator*((font_factory *)local_470);
  local_4a8[1] = 0;
  plural_::operator+(&local_4a0,(plural_ *)&plural,local_4a8 + 1);
  local_4a8[0] = 0;
  tests::operator+(&local_488,&local_4a0,local_4a8);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_470 + 0x10),(shared_ptr<agge::font> *)local_470,0.0,0.0,
             &local_488);
  plural_::operator+(&local_428,(plural_ *)&plural,(ref_glyph_run *)(local_470 + 0x10));
  ref_text_line::ref_text_line(&local_410,0.0,38.0,0.0,&local_428);
  tests::operator+(&local_1a8,&local_1c0,&local_410);
  local_4c8 = (text_line *)layout::begin((layout *)local_e8);
  local_4d0 = (text_line *)layout::end((layout *)local_e8);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            (&local_4c0,(tests *)local_4c8,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_4d0,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_190._16_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_518,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_519);
  ut::LocationInfo::LocationInfo(&local_4f8,&local_518,0x200);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_1a8,&local_4c0,&local_4f8);
  ut::LocationInfo::~LocationInfo(&local_4f8);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::vector<agge::text_line,_std::allocator<agge::text_line>_>::~vector(&local_4c0);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_1a8);
  ref_text_line::~ref_text_line(&local_410);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_428);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_470 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_488);
  std::vector<int,_std::allocator<int>_>::~vector(&local_4a0);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_470);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_1c0);
  ref_text_line::~ref_text_line(&local_318);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_330);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_378 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_390);
  std::vector<int,_std::allocator<int>_>::~vector(&local_3a8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_3c0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_3d8);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_378);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_1d8);
  ref_text_line::~ref_text_line(&local_200);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_218);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_260 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_278);
  std::vector<int,_std::allocator<int>_>::~vector(&local_290);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2a8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2c0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2d8);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_260);
  layout::~layout((layout *)local_e8);
  std::shared_ptr<agge::tests::LayoutTests::font_factory>::~shared_ptr
            ((shared_ptr<agge::tests::LayoutTests::font_factory> *)local_88);
  local_558 = (glyph *)&glyphs[1].outline.
                        super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_558 = local_558 + -1;
    mocks::font_accessor::glyph::~glyph(local_558);
  } while (local_558 !=
           (glyph *)&f.
                     super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
  return;
}

Assistant:

test( NextWordIsDisplayedWithoutSpacesOnWordBreakWhenNextWordIsFound )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L'A', 0 }, { L' ', 1 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 5, 0 } },
					{ { 4, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);
				layout l;

				// ACT
				l.process(R("AAAAA   AAAA    AA"), limit::wrap(39.0f), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 0 + 0 + 0 + 0))
					+ ref_text_line(0.0f, 24.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 0 + 0 + 0))
					+ ref_text_line(0.0f, 38.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 0)),
					mkvector(l.begin(), l.end()));
			}